

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O1

StringTree * capnp::compiler::tupleLiteral(Reader params)

{
  size_t *psVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  ulong capacity;
  StringTree *in_RDI;
  Branch *pBVar5;
  Branch *pBVar6;
  Branch *pBVar7;
  ElementCount index;
  Reader RVar8;
  StringPtr delim;
  uint in_stack_00000020;
  StringTree part;
  ArrayBuilder<kj::StringTree> parts;
  Array<kj::StringTree> result;
  Reader param;
  SegmentReader *pSVar9;
  CapTableReader *pCVar10;
  void *pvVar11;
  WirePointer *pWVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  StringTree local_190;
  Branch *local_158;
  Branch *pBStack_150;
  size_t *local_148;
  ArrayDisposer *local_140;
  undefined1 local_138 [40];
  CapTableReader *pCStack_110;
  Branch *pBStack_108;
  int iStack_100;
  undefined4 uStack_fc;
  Branch *local_f8;
  Branch *pBStack_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  StructReader local_d8;
  StringTree *local_a8;
  ArrayPtr<const_char> local_a0;
  StructReader local_90;
  StructReader local_60;
  
  capacity = (ulong)in_stack_00000020;
  index = 0;
  pBVar5 = (Branch *)0x0;
  local_a8 = in_RDI;
  local_158 = (Branch *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x38,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_148 = &local_158->index + capacity * 7;
  local_140 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBStack_150 = local_158;
  if (in_stack_00000020 != 0) {
    pcVar2 = local_190.text.content.ptr;
    sVar3 = local_190.text.content.size_;
    pBVar6 = local_190.branches.ptr;
    sVar4 = local_190.branches.size_;
    do {
      local_190.branches.size_ = sVar4;
      local_190.branches.ptr = pBVar6;
      local_190.text.content.size_ = sVar3;
      local_190.text.content.ptr = pcVar2;
      capnp::_::ListReader::getStructElement(&local_d8,(ListReader *)&stack0x00000008,index);
      if (local_d8.pointerCount < 2) {
        iStack_100 = 0x7fffffff;
        pCStack_110 = (CapTableReader *)0x0;
        pBStack_108 = (Branch *)0x0;
        local_138._32_8_ = (Branch *)0x0;
      }
      else {
        pBStack_108 = (Branch *)(local_d8.pointers + 1);
        pCStack_110 = local_d8.capTable;
        local_138._32_8_ = local_d8.segment;
        iStack_100 = local_d8.nestingLimit;
      }
      capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)(local_138 + 0x20),(word *)0x0);
      pSVar9 = local_60.segment;
      pCVar10 = local_60.capTable;
      pvVar11 = local_60.data;
      pWVar12 = local_60.pointers;
      uVar13 = local_60._32_8_;
      uVar14 = local_60._40_8_;
      expressionStringTree((Reader)part._8_48_);
      if ((0xf < local_d8.dataSize) && (*local_d8.data == 1)) {
        local_138._8_8_ = local_d8.capTable;
        local_138._16_8_ = local_d8.pointers;
        local_138._0_8_ = local_d8.segment;
        local_138._24_4_ = local_d8.nestingLimit;
        if (local_d8.pointerCount == 0) {
          local_138._8_8_ = (CapTableReader *)0x0;
          local_138._16_8_ = (WirePointer *)0x0;
          local_138._0_8_ = (Branch *)0x0;
          local_138._24_4_ = 0x7fffffff;
        }
        capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)local_138,(word *)0x0);
        local_138._8_8_ = local_90.capTable;
        local_138._16_8_ = local_90.pointers;
        local_138._0_8_ = local_90.segment;
        local_138._24_4_ = local_90.nestingLimit;
        if (local_90.pointerCount == 0) {
          local_138._8_8_ = (CapTableReader *)0x0;
          local_138._16_8_ = (WirePointer *)0x0;
          local_138._0_8_ = (SegmentReader *)0x0;
          local_138._24_4_ = 0x7fffffff;
        }
        RVar8 = capnp::_::PointerReader::getBlob<capnp::Text>
                          ((PointerReader *)local_138,(void *)0x0,0);
        local_138._0_8_ = RVar8.super_StringPtr.content.ptr;
        local_138._8_8_ = RVar8.super_StringPtr.content.size_ - 1;
        local_a0.ptr = " = ";
        local_a0.size_ = 3;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
                  ((StringTree *)(local_138 + 0x20),(StringTree *)local_138,&local_a0,
                   (ArrayPtr<const_char> *)&local_190,(StringTree *)pBVar5);
        pBVar6 = (Branch *)local_190.text.content.size_;
        pcVar2 = local_190.text.content.ptr;
        local_190.size_ = local_138._32_8_;
        if ((CapTableReader *)local_190.text.content.ptr != (CapTableReader *)0x0) {
          local_190.text.content.ptr = (char *)0x0;
          local_190.text.content.size_ = 0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_190.text.content.disposer._4_4_,
                               (int)local_190.text.content.disposer))
                    ((undefined8 *)
                     CONCAT44(local_190.text.content.disposer._4_4_,
                              (int)local_190.text.content.disposer),pcVar2,1,pBVar6,pBVar6,0,pSVar9,
                     pCVar10,pvVar11,pWVar12,uVar13,uVar14);
          pBVar5 = pBVar6;
        }
        pBVar7 = (Branch *)local_190.branches.size_;
        pBVar6 = local_190.branches.ptr;
        local_190.text.content.ptr = (char *)pCStack_110;
        local_190.text.content.size_ = (size_t)pBStack_108;
        local_190.text.content.disposer._0_4_ = iStack_100;
        local_190.text.content.disposer._4_4_ = uStack_fc;
        pCStack_110 = (CapTableReader *)0x0;
        pBStack_108 = (Branch *)0x0;
        if (local_190.branches.ptr != (Branch *)0x0) {
          local_190.branches.ptr = (Branch *)0x0;
          local_190.branches.size_ = 0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_190.branches.disposer._4_4_,local_190.branches.disposer._0_4_))
                    ((undefined8 *)
                     CONCAT44(local_190.branches.disposer._4_4_,local_190.branches.disposer._0_4_),
                     pBVar6,0x40);
          pBVar5 = pBVar7;
        }
        pBVar6 = pBStack_108;
        pCVar10 = pCStack_110;
        local_190.branches.ptr = local_f8;
        local_190.branches.size_ = (size_t)pBStack_f0;
        local_190.branches.disposer._0_4_ = uStack_e8;
        local_190.branches.disposer._4_4_ = uStack_e4;
        local_f8 = (Branch *)0x0;
        pBStack_f0 = (Branch *)0x0;
        if (pCStack_110 != (CapTableReader *)0x0) {
          pCStack_110 = (CapTableReader *)0x0;
          pBStack_108 = (Branch *)0x0;
          (*(code *)**(undefined8 **)CONCAT44(uStack_fc,iStack_100))
                    ((undefined8 *)CONCAT44(uStack_fc,iStack_100),pCVar10,1);
          pBVar5 = pBVar6;
        }
      }
      pBStack_150->index = local_190.size_;
      (pBStack_150->content).size_ = (size_t)local_190.text.content.ptr;
      (pBStack_150->content).text.content.ptr = (char *)local_190.text.content.size_;
      (pBStack_150->content).text.content.size_ =
           CONCAT44(local_190.text.content.disposer._4_4_,(int)local_190.text.content.disposer);
      local_190.text.content.ptr = (char *)0x0;
      pcVar2 = local_190.text.content.ptr;
      local_190.text.content.size_ = 0;
      sVar3 = local_190.text.content.size_;
      (pBStack_150->content).text.content.disposer = (ArrayDisposer *)local_190.branches.ptr;
      (pBStack_150->content).branches.ptr = (Branch *)local_190.branches.size_;
      (pBStack_150->content).branches.size_ =
           CONCAT44(local_190.branches.disposer._4_4_,local_190.branches.disposer._0_4_);
      local_190.branches.ptr = (Branch *)0x0;
      pBVar6 = local_190.branches.ptr;
      local_190.branches.size_ = 0;
      sVar4 = local_190.branches.size_;
      pBStack_150 = (Branch *)&(pBStack_150->content).branches.disposer;
      local_190.branches.size_ = 0;
      local_190.branches.ptr = (Branch *)0x0;
      local_190.text.content.size_ = 0;
      local_190.text.content.ptr = (char *)0x0;
      index = index + 1;
    } while (in_stack_00000020 != index);
  }
  pCStack_110 = (CapTableReader *)(((long)pBStack_150 - (long)local_158 >> 3) * 0x6db6db6db6db6db7);
  local_138._32_8_ = local_158;
  pBStack_108 = (Branch *)local_140;
  local_158 = (Branch *)0x0;
  pBStack_150 = (Branch *)0x0;
  local_148 = (size_t *)0x0;
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree(&local_190,(Array<kj::StringTree> *)(local_138 + 0x20),delim);
  kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
            (local_a8,(kj *)"( ",(char (*) [3])&local_190,(StringTree *)0x52a046,
             (char (*) [3])pBVar5);
  sVar3 = local_190.branches.size_;
  pBVar5 = local_190.branches.ptr;
  if (local_190.branches.ptr != (Branch *)0x0) {
    local_190.branches.ptr = (Branch *)0x0;
    local_190.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_190.branches.disposer._4_4_,local_190.branches.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_190.branches.disposer._4_4_,local_190.branches.disposer._0_4_),pBVar5,
               0x40,sVar3,sVar3,kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar3 = local_190.text.content.size_;
  pcVar2 = local_190.text.content.ptr;
  if ((CapTableReader *)local_190.text.content.ptr != (CapTableReader *)0x0) {
    local_190.text.content.ptr = (char *)0x0;
    local_190.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_190.text.content.disposer._4_4_,(int)local_190.text.content.disposer)
    )((undefined8 *)
      CONCAT44(local_190.text.content.disposer._4_4_,(int)local_190.text.content.disposer),pcVar2,1,
      sVar3,sVar3,0);
  }
  pCVar10 = pCStack_110;
  uVar13 = local_138._32_8_;
  if ((Branch *)local_138._32_8_ != (Branch *)0x0) {
    local_138._32_8_ = (Branch *)0x0;
    pCStack_110 = (CapTableReader *)0x0;
    (**(_func_int **)pBStack_108->index)
              (pBStack_108,uVar13,0x38,pCVar10,pCVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
  }
  psVar1 = local_148;
  pBVar6 = pBStack_150;
  pBVar5 = local_158;
  if (local_158 != (Branch *)0x0) {
    local_158 = (Branch *)0x0;
    pBStack_150 = (Branch *)0x0;
    local_148 = (size_t *)0x0;
    (**local_140->_vptr_ArrayDisposer)
              (local_140,pBVar5,0x38,((long)pBVar6 - (long)pBVar5 >> 3) * 0x6db6db6db6db6db7,
               ((long)psVar1 - (long)pBVar5 >> 3) * 0x6db6db6db6db6db7,
               kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
  }
  return local_a8;
}

Assistant:

static kj::StringTree tupleLiteral(List<Expression::Param>::Reader params) {
  auto parts = kj::heapArrayBuilder<kj::StringTree>(params.size());
  for (auto param: params) {
    auto part = expressionStringTree(param.getValue());
    if (param.isNamed()) {
      part = kj::strTree(param.getNamed().getValue(), " = ", kj::mv(part));
    }
    parts.add(kj::mv(part));
  }
  return kj::strTree("( ", kj::StringTree(parts.finish(), ", "), " )");
}